

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

void audit_regressor_interaction(audit_regressor_data *dat,audit_strings *f)

{
  bool bVar1;
  undefined1 uVar2;
  long in_RSI;
  string ns_pre;
  char *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc1;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 in_stack_ffffffffffffffc3;
  undefined4 in_stack_ffffffffffffffc4;
  value_type *in_stack_ffffffffffffffc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  if (in_RSI == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x354f54);
  }
  else {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffd0);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_ffffffffffffffd0);
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffd0,'*');
    }
    uVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffc4,
                                     CONCAT13(in_stack_ffffffffffffffc3,
                                              CONCAT12(in_stack_ffffffffffffffc2,
                                                       CONCAT11(in_stack_ffffffffffffffc1,
                                                                in_stack_ffffffffffffffc0)))),
                            in_stack_ffffffffffffffb8);
    if (((bool)uVar2) &&
       (in_stack_ffffffffffffffc2 =
             std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffffc4,
                                      CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffc2,
                                                              CONCAT11(in_stack_ffffffffffffffc1,
                                                                       in_stack_ffffffffffffffc0))))
                             ,in_stack_ffffffffffffffb8), (bool)in_stack_ffffffffffffffc2)) {
      std::__cxx11::string::append((string *)&stack0xffffffffffffffd0);
      std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffd0,'^');
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffc4,
                                     CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffc2,
                                                             CONCAT11(in_stack_ffffffffffffffc1,
                                                                      in_stack_ffffffffffffffc0)))),
                            in_stack_ffffffffffffffb8);
    if (bVar1) {
      std::__cxx11::string::append((string *)&stack0xffffffffffffffd0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  }
  return;
}

Assistant:

inline void audit_regressor_interaction(audit_regressor_data& dat, const audit_strings* f)
{
  // same as audit_interaction in gd.cc
  if (f == nullptr)
  {
    dat.ns_pre->pop_back();
    return;
  }

  string ns_pre;
  if (!dat.ns_pre->empty())
    ns_pre += '*';

  if (f->first != "" && ((f->first) != " "))
  {
    ns_pre.append(f->first);
    ns_pre += '^';
  }
  if (f->second != "")
  {
    ns_pre.append(f->second);
    dat.ns_pre->push_back(ns_pre);
  }
}